

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QASMFile.hpp
# Opt level: O3

int __thiscall
qclab::io::QASMFile::
parse1a<qclab::qgates::RotationZ<std::complex<double>>,qclab::QObject<std::complex<double>>>
          (QASMFile *this,string *name,string *command,
          unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
          *gate)

{
  pointer pcVar1;
  QObject<std::complex<double>_> *pQVar2;
  long *plVar3;
  int iVar4;
  string *psVar5;
  QRotationGate1<std::complex<double>_> *this_00;
  bool bVar6;
  long *local_80;
  size_t local_78;
  long local_70 [2];
  double local_60;
  unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
  *local_58;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  std::__cxx11::string::substr((ulong)&local_50,(ulong)command);
  local_80 = local_70;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_80);
  plVar3 = local_80;
  local_58 = gate;
  if (local_48 == local_78) {
    if (local_48 == 0) {
      bVar6 = true;
    }
    else {
      iVar4 = bcmp(local_50,local_80,local_48);
      bVar6 = iVar4 == 0;
    }
  }
  else {
    bVar6 = false;
  }
  if (plVar3 != local_70) {
    operator_delete(plVar3,local_70[0] + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  iVar4 = 0;
  if (bVar6) {
    psVar5 = (string *)std::__cxx11::string::erase((ulong)command,0);
    local_60 = parseAngle<double>(this,psVar5);
    psVar5 = (string *)std::__cxx11::string::erase((ulong)command,0);
    iVar4 = parseQubit(this,psVar5);
    this_00 = (QRotationGate1<std::complex<double>_> *)operator_new(0x20);
    qgates::QRotationGate1<std::complex<double>_>::QRotationGate1(this_00,iVar4,local_60,false);
    (this_00->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_> =
         (QObject<std::complex<double>_>)&PTR_nbQubits_001340f8;
    pQVar2 = (local_58->_M_t).
             super___uniq_ptr_impl<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_qclab::QObject<std::complex<double>_>_*,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
             .super__Head_base<0UL,_qclab::QObject<std::complex<double>_>_*,_false>._M_head_impl;
    (local_58->_M_t).
    super___uniq_ptr_impl<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_qclab::QObject<std::complex<double>_>_*,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
    .super__Head_base<0UL,_qclab::QObject<std::complex<double>_>_*,_false>._M_head_impl =
         (QObject<std::complex<double>_> *)this_00;
    iVar4 = 1;
    if (pQVar2 != (QObject<std::complex<double>_> *)0x0) {
      (*pQVar2->_vptr_QObject[0xd])();
    }
  }
  return iVar4;
}

Assistant:

int parse1a( std::string name , std::string& command ,
                   std::unique_ptr< GATE >& gate ) const {
        using T = typename G::value_type ;
        using R = qclab::real_t< T > ;
        const auto n1 = name.length() ;
        const auto n2 = qregName_.length() ;
        if ( command.substr( 0 , n1 + 1 ) == name + "(" ) {
          const auto angle = parseAngle< R >( command.erase( 0 , n1 + 1 ) ) ;
          const auto qubit = parseQubit(      command.erase( 0 , n2 + 1 ) ) ;
          gate = std::make_unique< G >( qubit , angle ) ;
          return 1 ;
        }
        return 0 ;
      }